

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_706387::RSATest_DISABLED_BlindingCacheConcurrency_Test::TestBody
          (RSATest_DISABLED_BlindingCacheConcurrency_Test *this)

{
  pointer *this_00;
  pointer __last;
  pointer __last_00;
  size_type __n;
  pointer __result;
  thread *ptVar1;
  anon_class_16_2_a232c0a2_for__M_head_impl *extraout_RDX;
  anon_class_16_2_a232c0a2_for__M_head_impl *__args;
  anon_class_16_2_a232c0a2_for__M_head_impl *extraout_RDX_00;
  anon_class_16_2_a232c0a2_for__M_head_impl *__args_00;
  anon_class_16_2_a232c0a2_for__M_head_impl *extraout_RDX_01;
  thread *thread;
  pointer ptVar2;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  char *in_R9;
  long lVar3;
  bool bVar4;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  anon_class_16_2_a232c0a2_for__M_head_impl worker;
  AssertHelper local_68;
  UniquePtr<RSA> rsa;
  uint8_t kDummyHash [32];
  
  rsa._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_rsa_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<rsa_st,_bssl::internal::Deleter,_true,_true>)
                 RSA_private_key_from_bytes((uint8_t *)&(anonymous_namespace)::kKey1,0x260);
  this_00 = &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         (tuple<rsa_st_*,_bssl::internal::Deleter>)
                         rsa._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl !=
                         (_Head_base<0UL,_rsa_st_*,_false>)0x0);
  if ((tuple<rsa_st_*,_bssl::internal::Deleter>)
      rsa._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl == (_Head_base<0UL,_rsa_st_*,_false>)0x0)
  {
    testing::Message::Message((Message *)&worker);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)kDummyHash,(internal *)&threads,(AssertionResult *)0x5222e5,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_test.cc"
               ,0x5c9,(char *)kDummyHash._0_8_);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&worker);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    std::__cxx11::string::~string((string *)kDummyHash);
    if (worker.rsa != (UniquePtr<RSA> *)0x0) {
      (*(code *)(((worker.rsa)->_M_t).super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl)->n)();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
    worker.kDummyHash = &kDummyHash;
    kDummyHash[0x10] = '\0';
    kDummyHash[0x11] = '\0';
    kDummyHash[0x12] = '\0';
    kDummyHash[0x13] = '\0';
    kDummyHash[0x14] = '\0';
    kDummyHash[0x15] = '\0';
    kDummyHash[0x16] = '\0';
    kDummyHash[0x17] = '\0';
    kDummyHash[0x18] = '\0';
    kDummyHash[0x19] = '\0';
    kDummyHash[0x1a] = '\0';
    kDummyHash[0x1b] = '\0';
    kDummyHash[0x1c] = '\0';
    kDummyHash[0x1d] = '\0';
    kDummyHash[0x1e] = '\0';
    kDummyHash[0x1f] = '\0';
    kDummyHash[0] = '\0';
    kDummyHash[1] = '\0';
    kDummyHash[2] = '\0';
    kDummyHash[3] = '\0';
    kDummyHash[4] = '\0';
    kDummyHash[5] = '\0';
    kDummyHash[6] = '\0';
    kDummyHash[7] = '\0';
    kDummyHash[8] = '\0';
    kDummyHash[9] = '\0';
    kDummyHash[10] = '\0';
    kDummyHash[0xb] = '\0';
    kDummyHash[0xc] = '\0';
    kDummyHash[0xd] = '\0';
    kDummyHash[0xe] = '\0';
    kDummyHash[0xf] = '\0';
    worker.rsa = &rsa;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar3 = 0x800;
    std::vector<std::thread,_std::allocator<std::thread>_>::reserve(&threads,0x800);
    __args = extraout_RDX;
    while (__last = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish, bVar4 = lVar3 != 0, lVar3 = lVar3 + -1,
          ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_start, bVar4) {
      if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        __n = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                        (&threads,1,"vector::_M_realloc_insert");
        __last_00 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start;
        __result = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                             (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                              ,__n);
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,(anonymous_namespace)::RSATest_DISABLED_BlindingCacheConcurrency_Test::TestBody()::__0&>
                  ((allocator_type *)(((long)__last - (long)ptVar2) + (long)__result),
                   (thread *)&worker,__args_00);
        ptVar1 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           (ptVar2,__last,__result,(allocator<std::thread> *)&threads);
        ptVar1 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           (__last,__last_00,ptVar1 + 1,(allocator<std::thread> *)&threads);
        std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                  (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,ptVar2,
                   (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar2 >> 3);
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = __result + __n;
        __args = extraout_RDX_01;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = __result;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = ptVar1;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,(anonymous_namespace)::RSATest_DISABLED_BlindingCacheConcurrency_Test::TestBody()::__0&>
                  ((allocator_type *)
                   threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish,(thread *)&worker,__args);
        __args = extraout_RDX_00;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish =
             threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    for (; ptVar2 != __last; ptVar2 = ptVar2 + 1) {
      std::thread::join();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  }
  std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr(&rsa);
  return;
}

Assistant:

TEST(RSATest, DISABLED_BlindingCacheConcurrency) {
  bssl::UniquePtr<RSA> rsa(RSA_private_key_from_bytes(kKey1, sizeof(kKey1)));
  ASSERT_TRUE(rsa);

#if defined(OPENSSL_TSAN)
  constexpr size_t kSignaturesPerThread = 10;
  constexpr size_t kNumThreads = 10;
#else
  constexpr size_t kSignaturesPerThread = 100;
  constexpr size_t kNumThreads = 2048;
#endif

  const uint8_t kDummyHash[32] = {0};
  auto worker = [&] {
    std::vector<uint8_t> sig(RSA_size(rsa.get()));
    for (size_t i = 0; i < kSignaturesPerThread; i++) {
      unsigned sig_len = sig.size();
      EXPECT_TRUE(RSA_sign(NID_sha256, kDummyHash, sizeof(kDummyHash),
                           sig.data(), &sig_len, rsa.get()));
    }
  };

  std::vector<std::thread> threads;
  threads.reserve(kNumThreads);
  for (size_t i = 0; i < kNumThreads; i++) {
    threads.emplace_back(worker);
  }
  for (auto &thread : threads) {
    thread.join();
  }
}